

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool EV_StopPoly(int polynum)

{
  DPolyAction *this;
  long lVar1;
  
  if (0 < (long)po_NumPolyobjs) {
    lVar1 = 0;
    do {
      if (*(int *)((long)polyobjs->bbox + lVar1 + -4) == polynum) {
        this = *(DPolyAction **)((long)polyobjs->bbox + lVar1 + 0x34);
        if (this == (DPolyAction *)0x0) {
          return true;
        }
        if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          DPolyAction::Stop(this);
          return true;
        }
        *(undefined8 *)((long)polyobjs->bbox + lVar1 + 0x34) = 0;
        return true;
      }
      lVar1 = lVar1 + 0xf0;
    } while ((long)po_NumPolyobjs * 0xf0 - lVar1 != 0);
  }
  return false;
}

Assistant:

bool EV_StopPoly(int polynum)
{
	FPolyObj *poly;

	if (NULL != (poly = PO_GetPolyobj(polynum)))
	{
		if (poly->specialdata != NULL)
		{
			poly->specialdata->Stop();
		}
		return true;
	}
	return false;
}